

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-xref.c
# Opt level: O3

void pdf_drop_xref_sections_imp
               (hd_context *ctx,pdf_document *doc,pdf_xref *xref_sections,int num_xref_sections)

{
  undefined8 *puVar1;
  long lVar2;
  pdf_obj *obj;
  undefined8 *puVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  if (0 < (int)xref_sections) {
    uVar6 = 0;
    do {
      lVar5 = uVar6 * 0x38;
      puVar3 = *(undefined8 **)((doc->lexbuf).base.buffer + lVar5 + -0x80);
      while (puVar3 != (undefined8 *)0x0) {
        puVar1 = (undefined8 *)*puVar3;
        iVar4 = *(int *)(puVar3 + 1);
        if (0 < iVar4) {
          lVar7 = 0x18;
          lVar8 = 0;
          do {
            lVar2 = puVar3[2];
            obj = *(pdf_obj **)(lVar2 + lVar7);
            if (obj != (pdf_obj *)0x0) {
              pdf_drop_obj(ctx,obj);
              hd_drop_buffer(ctx,*(hd_buffer **)(lVar2 + -8 + lVar7));
              iVar4 = *(int *)(puVar3 + 1);
            }
            lVar8 = lVar8 + 1;
            lVar7 = lVar7 + 0x20;
          } while (lVar8 < iVar4);
        }
        hd_free(ctx,(void *)puVar3[2]);
        hd_free(ctx,puVar3);
        puVar3 = puVar1;
      }
      pdf_drop_obj(ctx,*(pdf_obj **)((doc->lexbuf).base.buffer + lVar5 + -0x70));
      pdf_drop_obj(ctx,*(pdf_obj **)((doc->lexbuf).base.buffer + lVar5 + -0x78));
      while (puVar3 = *(undefined8 **)((doc->lexbuf).base.buffer + lVar5 + -0x68),
            puVar3 != (undefined8 *)0x0) {
        *(undefined8 *)((doc->lexbuf).base.buffer + lVar5 + -0x68) = puVar3[1];
        pdf_drop_obj(ctx,(pdf_obj *)*puVar3);
        hd_free(ctx,puVar3);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != ((ulong)xref_sections & 0xffffffff));
  }
  hd_free(ctx,doc);
  return;
}

Assistant:

static void pdf_drop_xref_sections_imp(hd_context *ctx, pdf_document *doc, pdf_xref *xref_sections, int num_xref_sections)
{
    pdf_unsaved_sig *usig;
    int x, e;

    for (x = 0; x < num_xref_sections; x++)
    {
        pdf_xref *xref = &xref_sections[x];
        pdf_xref_subsec *sub = xref->subsec;

        while (sub != NULL)
        {
            pdf_xref_subsec *next_sub = sub->next;
            for (e = 0; e < sub->len; e++)
            {
                pdf_xref_entry *entry = &sub->table[e];

                if (entry->obj)
                {
                    pdf_drop_obj(ctx, entry->obj);
                    hd_drop_buffer(ctx, entry->stm_buf);
                }
            }
            hd_free(ctx, sub->table);
            hd_free(ctx, sub);
            sub = next_sub;
        }

        pdf_drop_obj(ctx, xref->pre_repair_trailer);
        pdf_drop_obj(ctx, xref->trailer);

        while ((usig = xref->unsaved_sigs) != NULL)
        {
            xref->unsaved_sigs = usig->next;
            pdf_drop_obj(ctx, usig->field);
            hd_free(ctx, usig);
        }
    }

    hd_free(ctx, xref_sections);
}